

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void __thiscall zsummer::log4z::CLogerManager::CLogerManager(CLogerManager *this)

{
  mapped_type *pmVar1;
  LoggerInfo *local_60;
  allocator<char> local_41;
  key_type local_40;
  CLogerManager *local_10;
  CLogerManager *this_local;
  
  local_10 = this;
  CThread::CThread(&this->super_CThread);
  ILog4zManager::ILog4zManager(&this->super_ILog4zManager);
  (this->super_CThread)._vptr_CThread = (_func_int **)&PTR__CLogerManager_00158a60;
  (this->super_ILog4zManager)._vptr_ILog4zManager = (_func_int **)&PTR__CLogerManager_00158b10;
  CSem::CSem(&this->m_semaphore);
  std::__cxx11::string::string((string *)&this->m_configFile);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->m_ids);
  local_60 = this->m_loggers;
  do {
    LoggerInfo::LoggerInfo(local_60);
    local_60 = local_60 + 1;
  } while (local_60 != (LoggerInfo *)&this->m_logs);
  std::__cxx11::list<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>::list
            (&this->m_logs);
  CLock::CLock(&this->m_lock);
  this->m_bRuning = false;
  this->m_lastId = 0;
  GetProcessInfo(&this->m_loggers[0]._name,&this->m_loggers[0]._pid);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Main",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->m_ids,&local_40);
  *pmVar1 = 0;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this->m_ullStatusTotalPushLog = 0;
  this->m_ullStatusTotalPopLog = 0;
  this->m_ullStatusTotalWriteFileCount = 0;
  this->m_ullStatusTotalWriteFileBytes = 0;
  return;
}

Assistant:

CLogerManager()
	{
		m_bRuning = false;
		m_lastId = LOG4Z_MAIN_LOGGER_ID;
		GetProcessInfo(m_loggers[LOG4Z_MAIN_LOGGER_ID]._name, m_loggers[LOG4Z_MAIN_LOGGER_ID]._pid);
		m_ids[LOG4Z_MAIN_LOGGER_NAME] = LOG4Z_MAIN_LOGGER_ID;

		m_ullStatusTotalPushLog = 0;
		m_ullStatusTotalPopLog = 0;
		m_ullStatusTotalWriteFileCount = 0;
		m_ullStatusTotalWriteFileBytes = 0;
	}